

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

Option * getOptionPred(StringRef Name,size_t *Length,_func_bool_Option_ptr *Pred,
                      StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap)

{
  StringRef Key;
  bool bVar1;
  unsigned_long *puVar2;
  StringMapEntry<llvm::cl::Option_*> *pSVar3;
  size_t *psVar4;
  bool local_101;
  StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_e8;
  size_t *local_e0;
  char *local_d8;
  StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_d0;
  size_t *local_c8;
  char *local_c0;
  StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_b8;
  size_t *local_b0;
  char *local_a8;
  StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_a0;
  const_iterator OMI;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap_local;
  _func_bool_Option_ptr *Pred_local;
  size_t *Length_local;
  StringRef Name_local;
  unsigned_long local_50;
  char *local_48;
  unsigned_long local_40;
  size_t **local_38;
  undefined1 local_30 [16];
  char *local_20;
  size_t *local_18;
  undefined1 *local_10;
  
  local_a8 = (char *)Name.Length;
  local_b0 = (size_t *)Name.Data;
  OMI.
  super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
          )(StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
            )OptionsMap;
  Length_local = local_b0;
  Name_local.Data = local_a8;
  local_a0.Ptr = (StringMapEntryBase **)
                 llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::find(OptionsMap,Name);
  while( true ) {
    local_b8.Ptr = (StringMapEntryBase **)
                   llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end
                             (OMI.
                              super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                              .Ptr);
    bVar1 = llvm::
            StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
            ::operator==(&local_a0,(StringMapConstIterator<llvm::cl::Option_*> *)&local_b8);
    if (!bVar1 || Name_local.Data < (char *)0x2) break;
    local_38 = &Length_local;
    local_48 = Name_local.Data + -1;
    local_40 = 0;
    puVar2 = std::min<unsigned_long>(&local_40,(unsigned_long *)&Name_local);
    local_40 = *puVar2;
    psVar4 = (size_t *)((long)Length_local + local_40);
    local_50 = (long)Name_local.Data - local_40;
    puVar2 = std::min<unsigned_long>((unsigned_long *)&local_48,&local_50);
    local_d8 = (char *)*puVar2;
    local_10 = local_30;
    Key.Length = (size_t)local_d8;
    Key.Data = (char *)psVar4;
    local_e0 = psVar4;
    local_c8 = psVar4;
    local_c0 = local_d8;
    Length_local = psVar4;
    Name_local.Data = local_d8;
    local_20 = local_d8;
    local_18 = psVar4;
    local_d0.Ptr = (StringMapEntryBase **)
                   llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::find
                             (OMI.
                              super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                              .Ptr,Key);
    local_a0.Ptr = local_d0.Ptr;
  }
  local_e8.Ptr = (StringMapEntryBase **)
                 llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end
                           (OMI.
                            super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                            .Ptr);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                        *)&local_a0,(StringMapConstIterator<llvm::cl::Option_*> *)&local_e8);
  local_101 = false;
  if (bVar1) {
    pSVar3 = llvm::
             iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
             ::operator->((iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                           *)&local_a0);
    local_101 = (*Pred)(pSVar3->second);
  }
  if (local_101 == false) {
    Name_local.Length = 0;
  }
  else {
    *Length = (size_t)Name_local.Data;
    pSVar3 = llvm::
             iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
             ::operator->((iterator_facade_base<llvm::StringMapConstIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_const_llvm::StringMapEntry<llvm::cl::Option_*>_*,_const_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                           *)&local_a0);
    Name_local.Length = (size_t)pSVar3->second;
  }
  return (Option *)Name_local.Length;
}

Assistant:

static Option *getOptionPred(StringRef Name, size_t &Length,
                             bool (*Pred)(const Option *),
                             const StringMap<Option *> &OptionsMap) {

  StringMap<Option *>::const_iterator OMI = OptionsMap.find(Name);

  // Loop while we haven't found an option and Name still has at least two
  // characters in it (so that the next iteration will not be the empty
  // string.
  while (OMI == OptionsMap.end() && Name.size() > 1) {
    Name = Name.substr(0, Name.size() - 1); // Chop off the last character.
    OMI = OptionsMap.find(Name);
  }

  if (OMI != OptionsMap.end() && Pred(OMI->second)) {
    Length = Name.size();
    return OMI->second; // Found one!
  }
  return nullptr; // No option found!
}